

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

const_iterator __thiscall
frozen::
unordered_map<frozen::basic_string<char>,int,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
::find<frozen::basic_string<char>>
          (unordered_map<frozen::basic_string<char>,int,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
           *this,basic_string<char> *key)

{
  const_iterator this_00;
  bool bVar1;
  size_t sVar2;
  
  this_00 = (const_iterator)(this + 0xc00);
  sVar2 = bits::pmh_tables<128ul,frozen::elsa<frozen::basic_string<char>>>::
          lookup<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>>
                    ((pmh_tables<128ul,frozen::elsa<frozen::basic_string<char>>> *)this_00,key,
                     (elsa<frozen::basic_string<char>_> *)this_00);
  if (sVar2 != 0x80) {
    bVar1 = std::equal_to<frozen::basic_string<char>_>::operator()
                      ((equal_to<frozen::basic_string<char>_> *)this,
                       (basic_string<char> *)(this + sVar2 * 0x18),key);
    if (bVar1) {
      return (const_iterator)(this + sVar2 * 0x18);
    }
  }
  return this_00;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    return find_impl(*this, key, hash_function(), key_eq());
  }